

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O0

void cjson_add_null_should_add_null(void)

{
  cJSON *object;
  cJSON *pcVar1;
  cJSON *null;
  cJSON *root;
  
  object = cJSON_CreateObject();
  cJSON_AddNullToObject(object,"null");
  pcVar1 = cJSON_GetObjectItemCaseSensitive(object,"null");
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x37);
  }
  UnityAssertEqualNumber((long)pcVar1->type,4,(char *)0x0,0x38,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_null_should_add_null(void)
{
    cJSON *root = cJSON_CreateObject();
    cJSON *null = NULL;

    cJSON_AddNullToObject(root, "null");

    TEST_ASSERT_NOT_NULL(null = cJSON_GetObjectItemCaseSensitive(root, "null"));
    TEST_ASSERT_EQUAL_INT(null->type, cJSON_NULL);

    cJSON_Delete(root);
}